

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManIncrSimStart(Gia_Man_t *p,int nWords,int nObjs)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  int iVar5;
  
  if (p->fIncrSim == 0) {
    p->fIncrSim = 1;
    pwVar4 = (word *)0x0;
    p->iPatsPi = 0;
    p->nSimWords = nWords;
    p->iTimeStamp = 1;
    pVVar1 = (Vec_Int_t *)malloc(0x10);
    iVar5 = nWords;
    if (nWords - 1U < 0xf) {
      iVar5 = 0x10;
    }
    pVVar1->nSize = 0;
    pVVar1->nCap = iVar5;
    if (iVar5 == 0) {
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)malloc((long)iVar5 << 2);
    }
    pVVar1->pArray = piVar2;
    p->vTimeStamps = pVVar1;
    p->iNextPi = 0;
    pVVar3 = (Vec_Wrd_t *)malloc(0x10);
    iVar5 = nObjs * nWords;
    if (nObjs * nWords - 1U < 0xf) {
      iVar5 = 0x10;
    }
    pVVar3->nSize = 0;
    pVVar3->nCap = iVar5;
    if (iVar5 != 0) {
      pwVar4 = (word *)malloc((long)iVar5 << 3);
    }
    pVVar3->pArray = pwVar4;
    p->vSims = pVVar3;
    Gia_ManRandomW(1);
    return;
  }
  __assert_fail("!p->fIncrSim",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x480,"void Gia_ManIncrSimStart(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManIncrSimStart( Gia_Man_t * p, int nWords, int nObjs )
{
    assert( !p->fIncrSim );
    p->fIncrSim  = 1;
    p->iPatsPi   = 0;
    p->nSimWords = nWords;
    // init time stamps
    p->iTimeStamp  = 1;
    p->vTimeStamps = Vec_IntAlloc( p->nSimWords );
    // init object sim info
    p->iNextPi = 0;       
    p->vSims   = Vec_WrdAlloc( p->nSimWords * nObjs );
    Gia_ManRandomW( 1 );
}